

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primeextractor.cpp
# Opt level: O3

void __thiscall PrimeExtractor::extract(PrimeExtractor *this)

{
  long step;
  long *plVar1;
  ostream *poVar2;
  _Bit_type *p_Var3;
  _Bit_type *p_Var4;
  ulong uVar5;
  ulong uVar6;
  
  step = findNextStep(this);
  do {
    iterateVector(this,step);
    step = findNextStep(this);
    if (step < 1) break;
  } while (step <= this->stopSqrt);
  if (1 < this->stop) {
    plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,2);
    std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
    std::ostream::put((char)plVar1);
    std::ostream::flush();
  }
  p_Var3 = (this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  p_Var4 = (this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  uVar5 = (ulong)(this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  if (1 < uVar5 + ((long)p_Var4 - (long)p_Var3) * 8) {
    uVar6 = 1;
    do {
      if ((p_Var3[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) != 0) {
        poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        p_Var3 = (this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        p_Var4 = (this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
        uVar5 = (ulong)(this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < uVar5 + ((long)p_Var4 - (long)p_Var3) * 8);
  }
  return;
}

Assistant:

void PrimeExtractor::extract()
{
    long step = this->findNextStep();
    
    do {
      this->iterateVector(step);
      step = this->findNextStep();
    } while (step > 0 && step <= this->stopSqrt);
    if (this->stop >=2) {
      /**
       * Note: with the procedure described above 2 will never be 
       * calculated but it's prime.
       **/
      std::cout << 2 << std::endl;
    }
    for(long i = 1; i < this->primeCand.size() ; i++) {
      if (this->primeCand[i] == true) {
	  std::cout << i * 2 + 1 << std::endl;
      } 
	
    }
}